

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tokenizer.c
# Opt level: O2

STRING_TOKENIZER_HANDLE STRING_TOKENIZER_create_from_char(char *input)

{
  int iVar1;
  char *in_RAX;
  STRING_TOKENIZER_HANDLE __ptr;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  char *pcVar4;
  char *inputStringToMalloc;
  
  if (input == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Invalid Argument. Handle cannot be NULL.";
      iVar1 = 0x2e;
LAB_0017999e:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                ,"STRING_TOKENIZER_create_from_char",iVar1,1,pcVar4);
      return (STRING_TOKENIZER_HANDLE)0x0;
    }
  }
  else {
    inputStringToMalloc = in_RAX;
    __ptr = (STRING_TOKENIZER_HANDLE)calloc(1,0x18);
    if (__ptr == (STRING_TOKENIZER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Memory Allocation failed. Cannot allocate STRING_TOKENIZER.";
        iVar1 = 0x34;
        goto LAB_0017999e;
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s(&inputStringToMalloc,input);
      if (iVar1 == 0) {
        __ptr->inputString = inputStringToMalloc;
        __ptr->currentPos = inputStringToMalloc;
        sVar3 = strlen(inputStringToMalloc);
        __ptr->sizeOfinputString = sVar3;
        return __ptr;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                  ,"STRING_TOKENIZER_create_from_char",0x38,1,
                  "Memory Allocation Failed. Cannot allocate and copy string Content.");
      }
      free(__ptr);
    }
  }
  return (STRING_TOKENIZER_HANDLE)0x0;
}

Assistant:

extern STRING_TOKENIZER_HANDLE STRING_TOKENIZER_create_from_char(const char* input)
{
    STRING_TOKEN *result;
    char* inputStringToMalloc;

    /* Codes_SRS_STRING_07_001: [STRING_TOKENIZER_create shall return an NULL STRING_TOKENIZER_HANDLE if parameter input is NULL] */
    if (input == NULL)
    {
        LogError("Invalid Argument. Handle cannot be NULL.");
        result = NULL;
    }
    /* Codes_SRS_STRING_07_002: [STRING_TOKENIZER_create shall allocate a new STRING_TOKENIZER_HANDLE having the content of the STRING_HANDLE copied and current position pointing at the beginning of the string] */
    else if ((result = (STRING_TOKEN*)calloc(1, sizeof(STRING_TOKEN))) == NULL)
    {
        LogError("Memory Allocation failed. Cannot allocate STRING_TOKENIZER.");
    }
    else if ((mallocAndStrcpy_s(&inputStringToMalloc, input)) != 0)
    {
        LogError("Memory Allocation Failed. Cannot allocate and copy string Content.");
        free(result);
        result = NULL;
    }
    else
    {
        result->inputString = inputStringToMalloc;
        result->currentPos = result->inputString; //Current Pos will point to the initial position of Token.
        result->sizeOfinputString = strlen(result->inputString); //Calculate Size of Current String
    }
    return (STRING_TOKENIZER_HANDLE)result;
}